

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_read_until_errors(void)

{
  test tVar1;
  cio_inet_address *arg1;
  char *request;
  cio_http_location target;
  undefined1 local_248 [4];
  cio_error err;
  cio_http_server server;
  cio_http_server_configuration config;
  uint j;
  uint array_size;
  test test;
  uint i;
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
  *bs_read_until_fakes [4];
  
  for (test.which_read_until_fails = 0; test.which_read_until_fails < 4;
      test.which_read_until_fails = test.which_read_until_fails + 1) {
    tVar1 = test_read_until_errors::tests[test.which_read_until_fails];
    for (config.free_client._4_4_ = 0; config.free_client._4_4_ < 4;
        config.free_client._4_4_ = config.free_client._4_4_ + 1) {
      *(code **)&(&test)[config.free_client._4_4_].expected_response = bs_read_until_ok;
    }
    cio_buffered_stream_read_until_fake.custom_fake =
         (_func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
          *)0x0;
    *(code **)&(&test)[(ulong)tVar1 & 0xffffffff].expected_response = bs_read_until_call_fails;
    cio_buffered_stream_read_until_fake.custom_fake_seq =
         (_func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
          **)&test.expected_response;
    cio_buffered_stream_read_until_fake.custom_fake_seq_len = 4;
    header_complete_fake.custom_fake = callback_write_ok_response;
    memcpy(server.keepalive_header + 0x20,&DAT_00123500,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address((cio_socket_address *)(server.keepalive_header + 0x20),arg1,0x1f90)
    ;
    target.config._4_4_ =
         cio_http_server_init
                   ((cio_http_server *)local_248,&loop,
                    (cio_http_server_configuration *)(server.keepalive_header + 0x20));
    UnityAssertEqualNumber
              (0,(long)target.config._4_4_,"Server initialization failed!",0x31a,
               UNITY_DISPLAY_STYLE_INT);
    target.config._4_4_ =
         cio_http_location_init
                   ((cio_http_location *)&request,"/foo",(void *)0x0,alloc_dummy_handler);
    UnityAssertEqualNumber
              (0,(long)target.config._4_4_,"Request target initialization failed!",0x31e,
               UNITY_DISPLAY_STYLE_INT);
    target.config._4_4_ =
         cio_http_server_register_location
                   ((cio_http_server *)local_248,(cio_http_location *)&request);
    UnityAssertEqualNumber
              (0,(long)target.config._4_4_,"Register request target failed!",0x321,
               UNITY_DISPLAY_STYLE_INT);
    split_request("GET /foo HTTP/1.1\r\nfoo: bar\r\n\r\nGET /foo HTTP/1.1\r\nfoo: bar\r\n\r\n");
    target.config._4_4_ = cio_http_server_serve((cio_http_server *)local_248);
    UnityAssertEqualNumber
              (0,(long)target.config._4_4_,"Serving http failed!",0x328,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x32a,
               UNITY_DISPLAY_STYLE_INT);
    array_size = tVar1.expected_response;
    check_http_response(array_size);
    setUp();
  }
  free_dummy_client(client_socket);
  return;
}

Assistant:

static void test_read_until_errors(void)
{
	struct test {
		unsigned int which_read_until_fails;
		int expected_response;
	};

	static const struct test tests[] = {
	    {.which_read_until_fails = 0, .expected_response = 0},
	    {.which_read_until_fails = 1, .expected_response = 500},
	    {.which_read_until_fails = 2, .expected_response = 500},
	    {.which_read_until_fails = 3, .expected_response = 500},
	};

	enum cio_error (*bs_read_until_fakes[ARRAY_SIZE(tests)])(struct cio_buffered_stream *, struct cio_read_buffer *, const char *, cio_buffered_stream_read_handler_t, void *);
	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct test test = tests[i];

		unsigned int array_size = ARRAY_SIZE(bs_read_until_fakes);
		for (unsigned int j = 0; j < array_size; j++) {
			bs_read_until_fakes[j] = bs_read_until_ok;
		}

		cio_buffered_stream_read_until_fake.custom_fake = NULL;
		bs_read_until_fakes[test.which_read_until_fails] = bs_read_until_call_fails;
		SET_CUSTOM_FAKE_SEQ(cio_buffered_stream_read_until, bs_read_until_fakes, (int)array_size)

		header_complete_fake.custom_fake = callback_write_ok_response;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = close_timeout_ns,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		struct cio_http_location target;
		err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");

		err = cio_http_server_register_location(&server, &target);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

		const char *request = "GET /foo HTTP/1.1" CRLF "foo: bar" CRLF CRLF "GET /foo HTTP/1.1" CRLF "foo: bar" CRLF CRLF;

		split_request(request);

		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

		TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was not called!");
		check_http_response(test.expected_response);

		setUp();
	}

	free_dummy_client(client_socket);
}